

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O1

void d68020_cas2_16(void)

{
  uint uVar1;
  char *__format;
  uint in_EDI;
  
  if (((byte)g_cpu_type & 0x1c) != 0) {
    uVar1 = dasm_read_imm_32(in_EDI);
    sprintf(g_dasm_str,"cas2.w  D%d:D%d, D%d:D%d, (%c%d):(%c%d); (2+)",(ulong)(uVar1 >> 0x10 & 7),
            (ulong)(uVar1 & 7),(ulong)(uVar1 >> 0x16 & 7),(ulong)(uVar1 >> 6 & 7),
            (ulong)(((int)~uVar1 >> 0x1f) * -3 + 0x41),(ulong)(uVar1 >> 0x1c & 7),
            (ulong)((uint)(-1 < (short)uVar1) * 3 + 0x41),(ulong)(uVar1 >> 0xc & 7));
    return;
  }
  if ((~g_cpu_ir & 0xf000) == 0) {
    __format = "dc.w    $%04x; opcode 1111";
  }
  else {
    __format = "dc.w $%04x; ILLEGAL";
  }
  sprintf(g_dasm_str,__format);
  return;
}

Assistant:

static void d68020_cas2_16(void)
{
/* CAS2 Dc1:Dc2,Du1:Dc2:(Rn1):(Rn2)
f e d c b a 9 8 7 6 5 4 3 2 1 0
 DARn1  0 0 0  Du1  0 0 0  Dc1
 DARn2  0 0 0  Du2  0 0 0  Dc2
*/

	uint extension;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension = read_imm_32();
	sprintf(g_dasm_str, "cas2.w  D%d:D%d, D%d:D%d, (%c%d):(%c%d); (2+)",
		(extension>>16)&7, extension&7, (extension>>22)&7, (extension>>6)&7,
		BIT_1F(extension) ? 'A' : 'D', (extension>>28)&7,
		BIT_F(extension) ? 'A' : 'D', (extension>>12)&7);
}